

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_lowmc.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  mzd_local_t *__ptr;
  pointer pdVar1;
  pointer puVar2;
  ulong len;
  result_type rVar3;
  int iVar4;
  picnic_instance_t *lowmc;
  mzd_local_t *result;
  mzd_local_t *result_00;
  mzd_local_t *__ptr_00;
  long lVar5;
  long lVar6;
  ostream *poVar7;
  uint uVar8;
  undefined4 uVar9;
  ulong __n;
  const_iterator __end1;
  uint uVar10;
  pointer puVar11;
  const_iterator __begin1;
  duration<long,_std::ratio<1L,_1000000L>_> *pdVar12;
  vector<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>_>
  timings;
  vector<unsigned_char,_std::allocator<unsigned_char>_> rand_buffer;
  default_random_engine eng;
  uniform_int_distribution<unsigned_int> dist;
  random_device rnd;
  vector<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>_>
  local_1418;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_13f8;
  ulong local_13d8;
  lowmc_implementation_f local_13d0;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_13c8;
  param_type local_13c0;
  anon_union_5000_2_650ea050_for_random_device_0 local_13b8;
  
  parse_args((int)&local_13b8,(char **)(ulong)(uint)argc);
  if (local_13b8._4_4_ == PARAMETER_SET_INVALID) {
    iVar4 = 1;
  }
  else {
    uVar9 = local_13b8._0_4_;
    __n = (ulong)local_13b8.field_0._M_file & 0xffffffff;
    lowmc = picnic_instance_get(local_13b8._4_4_);
    if (lowmc == (picnic_instance_t *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Failed to create Picnic instance.",0x21);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
      std::ostream::put('p');
      std::ostream::flush();
    }
    else {
      local_1418.
      super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (duration<long,_std::ratio<1L,_1000000L>_> *)0x0;
      local_1418.
      super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (duration<long,_std::ratio<1L,_1000000L>_> *)0x0;
      local_1418.
      super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (duration<long,_std::ratio<1L,_1000000L>_> *)0x0;
      std::
      vector<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>_>
      ::reserve(&local_1418,__n);
      local_13d0 = lowmc_get_implementation(&lowmc->lowmc);
      result = mzd_local_init_ex(1,(uint)(lowmc->lowmc).n,true);
      result_00 = mzd_local_init_ex(1,(uint)(lowmc->lowmc).n,true);
      __ptr_00 = mzd_local_init_ex(1,(uint)(lowmc->lowmc).n,true);
      local_13f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (uint8_t *)0x0;
      local_13f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (uint8_t *)0x0;
      local_13f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar10 = (lowmc->lowmc).n + 7 >> 3;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&local_13f8,(ulong)(uVar10 * 2));
      local_13c0._M_a = 0;
      local_13c0._M_b = 0xff;
      local_13d8 = (ulong)uVar10;
      std::random_device::random_device((random_device *)&local_13b8.field_0);
      uVar10 = std::random_device::_M_getval();
      puVar2 = local_13f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      uVar8 = uVar10 / 0x7fffffff << 0x1f | uVar10 / 0x7fffffff;
      local_13c8._M_x = (unsigned_long)(uVar8 + uVar10 + (uint)(uVar10 + uVar8 == 0));
      if (local_13f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_13f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        puVar11 = local_13f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          rVar3 = std::uniform_int_distribution<unsigned_int>::operator()
                            ((uniform_int_distribution<unsigned_int> *)&local_13c0,&local_13c8,
                             &local_13c0);
          *puVar11 = (uint8_t)rVar3;
          puVar11 = puVar11 + 1;
        } while (puVar11 != puVar2);
      }
      std::random_device::_M_fini();
      len = local_13d8;
      mzd_from_char_array(result,local_13f8.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,local_13d8);
      mzd_from_char_array(result_00,
                          local_13f8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start + len,len);
      while (__ptr = result_00, uVar9 != 0) {
        lVar5 = std::chrono::_V2::system_clock::now();
        (*local_13d0)(result,__ptr,__ptr_00);
        lVar6 = std::chrono::_V2::system_clock::now();
        local_13b8.field_0._M_file = (void *)((lVar6 - lVar5) / 1000);
        if (local_1418.
            super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_1418.
            super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000000l>>>>
          ::_M_realloc_insert<std::chrono::duration<long,std::ratio<1l,1000000l>>>
                    ((vector<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000000l>>>>
                      *)&local_1418,
                     (iterator)
                     local_1418.
                     super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     (duration<long,_std::ratio<1L,_1000000L>_> *)&local_13b8.field_0);
        }
        else {
          (local_1418.
           super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->__r = (rep)local_13b8.field_0._M_file;
          local_1418.
          super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_1418.
               super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        uVar9 = (int)__n - 1;
        __n = (ulong)(uint)uVar9;
        result_00 = __ptr_00;
        __ptr_00 = __ptr;
      }
      free(__ptr_00);
      free(__ptr);
      free(result);
      pdVar1 = local_1418.
               super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pdVar12 = local_1418.
                     super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pdVar12 != pdVar1;
          pdVar12 = pdVar12 + 1) {
        poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
      }
      if (local_13f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uint8_t *)0x0) {
        operator_delete(local_13f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_1418.
          super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (duration<long,_std::ratio<1L,_1000000L>_> *)0x0) {
        operator_delete(local_1418.
                        super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int main(int argc, char** argv) {
  picnic_params_t params;
  unsigned int iter;
  std::tie(params, iter) = parse_args(argc, argv);
  if (params == PARAMETER_SET_INVALID) {
    return 1;
  }

  bench_lowmc(params, iter);
  return 0;
}